

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O3

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
Assimp::FBX::FBXConverter::ConvertLine
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          FBXConverter *this,LineGeometry *line,Model *model,aiMatrix4x4 *node_global_transform,
          aiNode *nd)

{
  pointer *ppuVar1;
  pointer __src;
  pointer piVar2;
  pointer piVar3;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *pvVar4;
  vector<int,_std::allocator<int>_> *pvVar5;
  aiMesh *paVar6;
  aiVector3D *__s;
  ulong *puVar7;
  aiFace *paVar8;
  uint *puVar9;
  uint *puVar10;
  uint uVar11;
  ulong uVar12;
  size_t __n;
  int iVar13;
  ulong uVar14;
  iterator __position;
  aiFace *paVar15;
  int iVar16;
  ulong uVar17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  undefined1 local_1a8 [376];
  
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar4 = LineGeometry::GetVertices(line);
  pvVar5 = LineGeometry::GetIndices(line);
  if (((pvVar4->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl.
       super__Vector_impl_data._M_start ==
       (pvVar4->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl.
       super__Vector_impl_data._M_finish) ||
     ((pvVar5->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_start ==
      (pvVar5->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish)) {
    std::operator+(&local_1c8,"ignoring empty line: ",&(line->super_Geometry).super_Object.name);
    Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
    basic_formatter<std::__cxx11::string>
              ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)local_1a8,
               &local_1c8);
    LogFunctions<Assimp::FBXImporter>::LogWarn((format *)local_1a8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p);
    }
  }
  else {
    paVar6 = SetupEmptyMesh(this,&line->super_Geometry,nd);
    *(byte *)&paVar6->mPrimitiveTypes = (byte)paVar6->mPrimitiveTypes | 2;
    uVar11 = (int)((long)(pvVar4->
                         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pvVar4->
                         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)
                         ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x55555555;
    paVar6->mNumVertices = uVar11;
    uVar17 = (ulong)uVar11 * 0xc;
    __s = (aiVector3D *)operator_new__(uVar17);
    if ((ulong)uVar11 != 0) {
      memset(__s,0,((uVar17 - 0xc) / 0xc) * 0xc + 0xc);
    }
    paVar6->mVertices = __s;
    __src = (pvVar4->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
            _M_impl.super__Vector_impl_data._M_start;
    __n = (long)(pvVar4->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)
                ._M_impl.super__Vector_impl_data._M_finish - (long)__src;
    if (__n != 0) {
      memmove(__s,__src,__n);
    }
    piVar2 = (pvVar5->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_start;
    piVar3 = (pvVar5->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_finish;
    uVar17 = (long)piVar3 - (long)piVar2 >> 2;
    if (piVar3 == piVar2) {
      iVar13 = 0;
    }
    else {
      uVar12 = 0;
      iVar13 = 0;
      do {
        iVar13 = iVar13 - (piVar2[uVar12] >> 0x1f);
        uVar12 = uVar12 + 1;
      } while ((uVar12 & 0xffffffff) < uVar17);
    }
    iVar16 = (int)uVar17;
    uVar12 = (ulong)(uint)(iVar16 - iVar13);
    paVar6->mNumFaces = iVar16 - iVar13;
    puVar7 = (ulong *)operator_new__(uVar12 * 0x10 + 8);
    *puVar7 = uVar12;
    paVar15 = (aiFace *)(puVar7 + 1);
    if (iVar16 != iVar13) {
      paVar8 = paVar15;
      do {
        paVar8->mNumIndices = 0;
        paVar8->mIndices = (uint *)0x0;
        paVar8 = paVar8 + 1;
      } while (paVar8 != paVar15 + uVar12);
    }
    paVar6->mFaces = paVar15;
    if (iVar16 == 0) {
      puVar10 = (uint *)0x0;
      __position._M_current = (uint *)0x0;
    }
    else {
      uVar12 = 0;
      do {
        if (-1 < (pvVar5->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar12]) {
          paVar15->mNumIndices = 2;
          puVar9 = (uint *)operator_new__(8);
          paVar15->mIndices = puVar9;
          puVar10 = paVar15->mIndices;
          paVar15 = paVar15 + 1;
          piVar2 = (pvVar5->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          *puVar9 = piVar2[uVar12];
          uVar14 = 0;
          if (uVar12 + 1 != (uVar17 & 0xffffffff)) {
            uVar14 = uVar12 + 1 & 0xffffffff;
          }
          uVar11 = piVar2[uVar14];
          puVar10[1] = (int)uVar11 >> 0x1f ^ uVar11;
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 != (uVar17 & 0xffffffff));
      __position._M_current =
           (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
           ._M_impl.super__Vector_impl_data._M_finish;
      puVar10 = (__return_storage_ptr__->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage;
    }
    local_1a8._0_4_ =
         (int)((ulong)((long)(this->meshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->meshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                            _M_impl.super__Vector_impl_data._M_start) >> 3) - 1;
    if (__position._M_current == puVar10) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (__return_storage_ptr__,__position,(uint *)local_1a8);
    }
    else {
      *__position._M_current = local_1a8._0_4_;
      ppuVar1 = &(__return_storage_ptr__->
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppuVar1 = *ppuVar1 + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<unsigned int> FBXConverter::ConvertLine(const LineGeometry& line, const Model& model,
            const aiMatrix4x4& node_global_transform, aiNode& nd)
        {
            std::vector<unsigned int> temp;

            const std::vector<aiVector3D>& vertices = line.GetVertices();
            const std::vector<int>& indices = line.GetIndices();
            if (vertices.empty() || indices.empty()) {
                FBXImporter::LogWarn("ignoring empty line: " + line.Name());
                return temp;
            }

            aiMesh* const out_mesh = SetupEmptyMesh(line, nd);
            out_mesh->mPrimitiveTypes |= aiPrimitiveType_LINE;

            // copy vertices
            out_mesh->mNumVertices = static_cast<unsigned int>(vertices.size());
            out_mesh->mVertices = new aiVector3D[out_mesh->mNumVertices];
            std::copy(vertices.begin(), vertices.end(), out_mesh->mVertices);

            //Number of line segments (faces) is "Number of Points - Number of Endpoints"
            //N.B.: Endpoints in FbxLine are denoted by negative indices.
            //If such an Index is encountered, add 1 and multiply by -1 to get the real index.
            unsigned int epcount = 0;
            for (unsigned i = 0; i < indices.size(); i++)
            {
                if (indices[i] < 0) {
                    epcount++;
                }
            }
            unsigned int pcount = static_cast<unsigned int>( indices.size() );
            unsigned int scount = out_mesh->mNumFaces = pcount - epcount;

            aiFace* fac = out_mesh->mFaces = new aiFace[scount]();
            for (unsigned int i = 0; i < pcount; ++i) {
                if (indices[i] < 0) continue;
                aiFace& f = *fac++;
                f.mNumIndices = 2; //2 == aiPrimitiveType_LINE 
                f.mIndices = new unsigned int[2];
                f.mIndices[0] = indices[i];
                int segid = indices[(i + 1 == pcount ? 0 : i + 1)];   //If we have reached he last point, wrap around
                f.mIndices[1] = (segid < 0 ? (segid + 1)*-1 : segid); //Convert EndPoint Index to normal Index
            }
            temp.push_back(static_cast<unsigned int>(meshes.size() - 1));
            return temp;
        }